

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

float common_embd_similarity_cos(float *embd1,float *embd2,int n)

{
  float fVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dStack_10;
  
  if (n < 1) {
    bVar5 = true;
    bVar4 = true;
  }
  else {
    dVar8 = 0.0;
    dVar3 = 0.0;
    dVar9 = 0.0;
    uVar6 = 0;
    do {
      fVar7 = embd2[uVar6];
      fVar1 = embd1[uVar6];
      dVar8 = dVar8 + (double)(fVar1 * fVar1);
      dVar3 = dVar3 + (double)(fVar7 * fVar1);
      dVar9 = dVar9 + (double)(fVar7 * fVar7);
      uVar6 = uVar6 + 1;
    } while ((uint)n != uVar6);
    bVar4 = dVar8 == 0.0;
    bVar5 = dVar9 == 0.0;
    if (((dVar8 != 0.0) || (NAN(dVar8))) && ((dVar9 != 0.0 || (NAN(dVar9))))) {
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = dVar8;
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      dStack_10 = auVar2._8_8_;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      return (float)(dStack_10 / (dVar8 * dVar9));
    }
  }
  if ((bool)(bVar4 & bVar5)) {
    fVar7 = 1.0;
  }
  else {
    fVar7 = 0.0;
  }
  return fVar7;
}

Assistant:

float common_embd_similarity_cos(const float * embd1, const float * embd2, int n){
    double sum  = 0.0;
    double sum1 = 0.0;
    double sum2 = 0.0;

    for (int i = 0; i < n; i++) {
        sum  += embd1[i] * embd2[i];
        sum1 += embd1[i] * embd1[i];
        sum2 += embd2[i] * embd2[i];
    }

    // Handle the case where one or both vectors are zero vectors
    if (sum1 == 0.0 || sum2 == 0.0) {
        if (sum1 == 0.0 && sum2 == 0.0) {
            return 1.0f; // two zero vectors are similar
        }
        return 0.0f;
    }

    return sum / (sqrt(sum1) * sqrt(sum2));
}